

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opl.cpp
# Opt level: O1

void __thiscall ymfm::opll_registers::opll_registers(opll_registers *this)

{
  uint16_t uVar1;
  int iVar2;
  uint32_t index_1;
  ulong uVar3;
  ushort uVar4;
  uint16_t uVar5;
  uint32_t index;
  long lVar6;
  
  this->m_lfo_am_counter = 0;
  this->m_lfo_pm_counter = 0;
  this->m_noise_lfsr = 1;
  this->m_lfo_am = '\0';
  iVar2 = 0;
  uVar4 = 0;
  lVar6 = 0;
  do {
    this->m_waveform[0][lVar6] =
         uVar4 & 0x8000 |
         *(ushort *)
          (abs_sin_attenuation(unsigned_int)::s_sin_table +
          (ulong)(((uint)lVar6 ^ iVar2 >> 0x1f) & 0xff) * 2);
    lVar6 = lVar6 + 1;
    uVar4 = uVar4 + 0x40;
    iVar2 = iVar2 + 0x800000;
  } while (lVar6 != 0x400);
  uVar1 = this->m_waveform[0][0];
  uVar3 = 0;
  do {
    uVar5 = uVar1;
    if (uVar3 < 0x200) {
      uVar5 = this->m_waveform[0][uVar3];
    }
    this->m_waveform[1][uVar3] = uVar5;
    uVar3 = uVar3 + 1;
  } while (uVar3 != 0x400);
  lVar6 = 2;
  do {
    this->m_chinst[lVar6 + -2] = this->m_regdata;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0xb);
  lVar6 = 0;
  do {
    this->m_opinst[lVar6] = this->m_regdata + ((uint)lVar6 & 1);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x12);
  return;
}

Assistant:

opll_registers::opll_registers() :
	m_lfo_am_counter(0),
	m_lfo_pm_counter(0),
	m_noise_lfsr(1),
	m_lfo_am(0)
{
	// create the waveforms
	for (uint32_t index = 0; index < WAVEFORM_LENGTH; index++)
		m_waveform[0][index] = abs_sin_attenuation(index) | (bitfield(index, 9) << 15);

	uint16_t zeroval = m_waveform[0][0];
	for (uint32_t index = 0; index < WAVEFORM_LENGTH; index++)
		m_waveform[1][index] = bitfield(index, 9) ? zeroval : m_waveform[0][index];

	// initialize the instruments to something sane
	for (uint32_t choffs = 0; choffs < CHANNELS; choffs++)
		m_chinst[choffs] = &m_regdata[0];
	for (uint32_t opoffs = 0; opoffs < OPERATORS; opoffs++)
		m_opinst[opoffs] = &m_regdata[bitfield(opoffs, 0)];
}